

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::TimeZoneFormat::formatExemplarLocation
          (TimeZoneFormat *this,TimeZone *tz,UnicodeString *name)

{
  short sVar1;
  TimeZoneNames *pTVar2;
  undefined4 uVar3;
  UChar *pUVar4;
  int32_t length;
  UnicodeString location;
  UChar locationBuf [128];
  ConstChar16Ptr local_1c8;
  ConstChar16Ptr local_1c0;
  char16_t *local_1b8;
  UChar *local_1a8;
  UnicodeString local_198;
  UnicodeString local_158;
  UChar local_118 [128];
  
  UnicodeString::UnicodeString(&local_198,local_118,0,0x80);
  pUVar4 = ZoneMeta::getCanonicalCLDRID(tz);
  if (pUVar4 != (UChar *)0x0) {
    pTVar2 = this->fTimeZoneNames;
    local_1c0.p_ = pUVar4;
    UnicodeString::UnicodeString(&local_158,'\x01',&local_1c0,-1);
    (*(pTVar2->super_UObject)._vptr_UObject[0xb])(pTVar2,&local_158,&local_198);
    UnicodeString::~UnicodeString(&local_158);
    local_1a8 = local_1c0.p_;
  }
  uVar3 = local_198.fUnion.fFields.fLength;
  if (-1 < local_198.fUnion.fStackFields.fLengthAndFlags) {
    uVar3 = (int)local_198.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  if ((int)uVar3 < 1) {
    pTVar2 = this->fTimeZoneNames;
    local_1c8.p_ = (char16_t *)UNKNOWN_ZONE_ID;
    UnicodeString::UnicodeString(&local_158,'\x01',&local_1c8,-1);
    (*(pTVar2->super_UObject)._vptr_UObject[0xb])(pTVar2,&local_158,&local_198);
    UnicodeString::~UnicodeString(&local_158);
    local_1b8 = local_1c8.p_;
    if (-1 < local_198.fUnion.fStackFields.fLengthAndFlags) {
      local_198.fUnion.fFields.fLength = (int)local_198.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if (local_198.fUnion.fFields.fLength < 1) {
      UnicodeString::unBogus(name);
      sVar1 = (name->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        length = (name->fUnion).fFields.fLength;
      }
      else {
        length = (int)sVar1 >> 5;
      }
      UnicodeString::doReplace(name,0,length,(UChar *)UNKNOWN_LOCATION,0,-1);
      goto LAB_001f5820;
    }
  }
  UnicodeString::copyFrom(name,&local_198,'\0');
LAB_001f5820:
  UnicodeString::~UnicodeString(&local_198);
  return name;
}

Assistant:

UnicodeString&
TimeZoneFormat::formatExemplarLocation(const TimeZone& tz, UnicodeString& name) const {
    UChar locationBuf[ZONE_NAME_U16_MAX];
    UnicodeString location(locationBuf, 0, UPRV_LENGTHOF(locationBuf));
    const UChar* canonicalID = ZoneMeta::getCanonicalCLDRID(tz);

    if (canonicalID) {
        fTimeZoneNames->getExemplarLocationName(UnicodeString(TRUE, canonicalID, -1), location);
    }
    if (location.length() > 0) {
        name.setTo(location);
    } else {
        // Use "unknown" location
        fTimeZoneNames->getExemplarLocationName(UnicodeString(TRUE, UNKNOWN_ZONE_ID, -1), location);
        if (location.length() > 0) {
            name.setTo(location);
        } else {
            // last resort
            name.setTo(UNKNOWN_LOCATION, -1);
        }
    }
    return name;
}